

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRDetector.cpp
# Opt level: O2

PatternView * ZXing::QRCode::FindPattern(PatternView *__return_storage_ptr__,PatternView *view)

{
  Iterator puVar1;
  int iVar2;
  Iterator puVar3;
  Iterator extraout_RDX;
  Iterator puVar4;
  double dVar5;
  undefined8 uVar6;
  Iterator local_38;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  Iterator local_28;
  Iterator puStack_20;
  
  iVar2 = view->_size;
  if (4 < iVar2) {
    puVar3 = view->_data;
    local_28 = view->_base;
    puStack_20 = view->_end;
    uStack_30 = 5;
    local_38 = puVar3;
    if (puVar3 == local_28 + 1) {
      dVar5 = FindPattern::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)&local_38,(PatternView *)0x7fffffff,(int)puVar3)
      ;
      if ((dVar5 != 0.0) || (NAN(dVar5))) {
LAB_0018f391:
        uVar6 = CONCAT44(uStack_2c,uStack_30);
        __return_storage_ptr__->_base = local_28;
        __return_storage_ptr__->_end = puStack_20;
        goto LAB_0018f3a1;
      }
      puVar3 = view->_data;
      iVar2 = view->_size;
    }
    puVar4 = puVar3 + (long)iVar2 + -5;
    puVar1 = local_38;
    while (puVar1 < puVar4) {
      dVar5 = FindPattern::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)&local_38,(PatternView *)(ulong)puVar1[-1],
                         (int)puVar3);
      if ((dVar5 != 0.0) || (NAN(dVar5))) goto LAB_0018f391;
      puVar1 = (Iterator)0x0;
      puVar3 = extraout_RDX;
      if (local_38 != (Iterator)0x0) {
        puVar1 = local_38 + 2;
        local_38 = puVar1;
      }
    }
  }
  local_38 = (Iterator)0x0;
  uVar6 = 0;
  __return_storage_ptr__->_base = (Iterator)0x0;
  __return_storage_ptr__->_end = (Iterator)0x0;
LAB_0018f3a1:
  __return_storage_ptr__->_data = local_38;
  *(undefined8 *)&__return_storage_ptr__->_size = uVar6;
  return __return_storage_ptr__;
}

Assistant:

PatternView FindPattern(const PatternView& view)
{
	return FindLeftGuard<PATTERN.size()>(view, PATTERN.size(), [](const PatternView& view, int spaceInPixel) {
		// perform a fast plausability test for 1:1:3:1:1 pattern
		if (view[2] < 2 * std::max(view[0], view[4]) || view[2] < std::max(view[1], view[3]))
			return 0.;
		return IsPattern<E2E>(view, PATTERN, spaceInPixel, 0.1); // the requires 4, here we accept almost 0
	});
}